

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MPMCQueueTest.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  ptrdiff_t pVar2;
  size_type sVar3;
  pointer piVar4;
  __int_type_conflict _Var5;
  thread *thread;
  iterator __end1;
  iterator __begin1;
  vector<std::thread,_std::allocator<std::thread>_> *__range1;
  uint64_t i_2;
  uint64_t i_1;
  atomic<unsigned_long> sum;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  atomic<bool> flag;
  MPMCQueue<uint64_t> q_5;
  uint64_t numThreads;
  uint64_t numOps;
  exception *anon_var_0;
  MPMCQueue<int> q_4;
  bool throws;
  unique_ptr<int,_std::default_delete<int>_> v_1;
  MPMCQueue<std::unique_ptr<int>_> q_3;
  Test v;
  MPMCQueue<Test> q_2;
  int t_1;
  MPMCQueue<int> q_1;
  TestType t;
  int i;
  MPMCQueue<TestType> q;
  bool local_77e;
  bool local_77c;
  byte local_77a;
  byte local_779;
  byte local_76c;
  byte local_76b;
  byte local_76a;
  bool local_769;
  __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
  local_758;
  __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
  local_750;
  vector<std::thread,_std::allocator<std::thread>_> *local_748;
  type local_740;
  thread local_720;
  ulong local_718;
  type local_710;
  thread local_6f8;
  ulong local_6f0;
  atomic<unsigned_long> local_6e8;
  vector<std::thread,_std::allocator<std::thread>_> local_6e0;
  atomic<bool> local_6c2;
  allocator<rigtorp::mpmc::Slot<unsigned_long>_> local_6c1;
  Queue<unsigned_long,_std::allocator<rigtorp::mpmc::Slot<unsigned_long>_>_> local_6c0;
  undefined8 local_5e0;
  undefined8 local_5d8;
  allocator<rigtorp::mpmc::Slot<int>_> local_5c1;
  Queue<int,_std::allocator<rigtorp::mpmc::Slot<int>_>_> local_5c0;
  byte local_4f1;
  unique_ptr<int,std::default_delete<int>> local_4f0 [8];
  unique_ptr<int,std::default_delete<int>> local_4e8 [8];
  unique_ptr<int,std::default_delete<int>> local_4e0 [8];
  unique_ptr<int,std::default_delete<int>> local_4d8 [8];
  unique_ptr<int,_std::default_delete<int>_> local_4d0;
  allocator<rigtorp::mpmc::Slot<std::unique_ptr<int,_std::default_delete<int>_>_>_> local_4c1;
  Queue<std::unique_ptr<int,_std::default_delete<int>_>,_std::allocator<rigtorp::mpmc::Slot<std::unique_ptr<int,_std::default_delete<int>_>_>_>_>
  local_4c0;
  Test local_3c4;
  Test local_3c3;
  Test local_3c2;
  allocator<rigtorp::mpmc::Slot<Test>_> local_3c1;
  Queue<Test,_std::allocator<rigtorp::mpmc::Slot<Test>_>_> local_3c0;
  int local_2d0 [3];
  allocator<rigtorp::mpmc::Slot<int>_> local_2c1;
  Queue<int,_std::allocator<rigtorp::mpmc::Slot<int>_>_> local_2c0;
  TestType local_1d9;
  int local_158;
  allocator<rigtorp::mpmc::Slot<TestType>_> local_141;
  Queue<TestType,_std::allocator<rigtorp::mpmc::Slot<TestType>_>_> local_140;
  undefined4 local_54;
  
  local_54 = 0;
  std::allocator<rigtorp::mpmc::Slot<TestType>_>::allocator(&local_141);
  rigtorp::mpmc::Queue<TestType,_std::allocator<rigtorp::mpmc::Slot<TestType>_>_>::Queue
            (&local_140,0xb,&local_141);
  std::allocator<rigtorp::mpmc::Slot<TestType>_>::~allocator(&local_141);
  pVar2 = rigtorp::mpmc::Queue<TestType,_std::allocator<rigtorp::mpmc::Slot<TestType>_>_>::size
                    (&local_140);
  local_769 = false;
  if (pVar2 == 0) {
    local_769 = rigtorp::mpmc::Queue<TestType,_std::allocator<rigtorp::mpmc::Slot<TestType>_>_>::
                empty(&local_140);
  }
  if (local_769 == false) {
    __assert_fail("q.size() == 0 && q.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/rigtorp[P]MPMCQueue/src/MPMCQueueTest.cpp"
                  ,0x4d,"int main(int, char **)");
  }
  for (local_158 = 0; local_158 < 10; local_158 = local_158 + 1) {
    rigtorp::mpmc::Queue<TestType,_std::allocator<rigtorp::mpmc::Slot<TestType>_>_>::emplace<>
              (&local_140);
  }
  pVar2 = rigtorp::mpmc::Queue<TestType,_std::allocator<rigtorp::mpmc::Slot<TestType>_>_>::size
                    (&local_140);
  local_76a = 0;
  if (pVar2 == 10) {
    bVar1 = rigtorp::mpmc::Queue<TestType,_std::allocator<rigtorp::mpmc::Slot<TestType>_>_>::empty
                      (&local_140);
    local_76a = bVar1 ^ 0xff;
  }
  if ((local_76a & 1) == 0) {
    __assert_fail("q.size() == 10 && !q.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/rigtorp[P]MPMCQueue/src/MPMCQueueTest.cpp"
                  ,0x51,"int main(int, char **)");
  }
  sVar3 = std::set<const_TestType_*,_std::less<const_TestType_*>,_std::allocator<const_TestType_*>_>
          ::size(&TestType::constructed);
  if (sVar3 != 10) {
    __assert_fail("TestType::constructed.size() == 10",
                  "/workspace/llm4binary/github/license_c_cmakelists/rigtorp[P]MPMCQueue/src/MPMCQueueTest.cpp"
                  ,0x52,"int main(int, char **)");
  }
  TestType::TestType(&local_1d9);
  rigtorp::mpmc::Queue<TestType,_std::allocator<rigtorp::mpmc::Slot<TestType>_>_>::pop
            (&local_140,&local_1d9);
  pVar2 = rigtorp::mpmc::Queue<TestType,_std::allocator<rigtorp::mpmc::Slot<TestType>_>_>::size
                    (&local_140);
  local_76b = 0;
  if (pVar2 == 9) {
    bVar1 = rigtorp::mpmc::Queue<TestType,_std::allocator<rigtorp::mpmc::Slot<TestType>_>_>::empty
                      (&local_140);
    local_76b = bVar1 ^ 0xff;
  }
  if ((local_76b & 1) == 0) {
    __assert_fail("q.size() == 9 && !q.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/rigtorp[P]MPMCQueue/src/MPMCQueueTest.cpp"
                  ,0x56,"int main(int, char **)");
  }
  sVar3 = std::set<const_TestType_*,_std::less<const_TestType_*>,_std::allocator<const_TestType_*>_>
          ::size(&TestType::constructed);
  if (sVar3 != 10) {
    __assert_fail("TestType::constructed.size() == 10",
                  "/workspace/llm4binary/github/license_c_cmakelists/rigtorp[P]MPMCQueue/src/MPMCQueueTest.cpp"
                  ,0x57,"int main(int, char **)");
  }
  rigtorp::mpmc::Queue<TestType,_std::allocator<rigtorp::mpmc::Slot<TestType>_>_>::pop
            (&local_140,&local_1d9);
  rigtorp::mpmc::Queue<TestType,_std::allocator<rigtorp::mpmc::Slot<TestType>_>_>::emplace<>
            (&local_140);
  pVar2 = rigtorp::mpmc::Queue<TestType,_std::allocator<rigtorp::mpmc::Slot<TestType>_>_>::size
                    (&local_140);
  local_76c = 0;
  if (pVar2 == 9) {
    bVar1 = rigtorp::mpmc::Queue<TestType,_std::allocator<rigtorp::mpmc::Slot<TestType>_>_>::empty
                      (&local_140);
    local_76c = bVar1 ^ 0xff;
  }
  if ((local_76c & 1) == 0) {
    __assert_fail("q.size() == 9 && !q.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/rigtorp[P]MPMCQueue/src/MPMCQueueTest.cpp"
                  ,0x5b,"int main(int, char **)");
  }
  sVar3 = std::set<const_TestType_*,_std::less<const_TestType_*>,_std::allocator<const_TestType_*>_>
          ::size(&TestType::constructed);
  if (sVar3 != 10) {
    __assert_fail("TestType::constructed.size() == 10",
                  "/workspace/llm4binary/github/license_c_cmakelists/rigtorp[P]MPMCQueue/src/MPMCQueueTest.cpp"
                  ,0x5c,"int main(int, char **)");
  }
  TestType::~TestType(&local_1d9);
  rigtorp::mpmc::Queue<TestType,_std::allocator<rigtorp::mpmc::Slot<TestType>_>_>::~Queue
            (&local_140);
  sVar3 = std::set<const_TestType_*,_std::less<const_TestType_*>,_std::allocator<const_TestType_*>_>
          ::size(&TestType::constructed);
  if (sVar3 != 0) {
    __assert_fail("TestType::constructed.size() == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rigtorp[P]MPMCQueue/src/MPMCQueueTest.cpp"
                  ,0x5e,"int main(int, char **)");
  }
  std::allocator<rigtorp::mpmc::Slot<int>_>::allocator(&local_2c1);
  rigtorp::mpmc::Queue<int,_std::allocator<rigtorp::mpmc::Slot<int>_>_>::Queue
            (&local_2c0,1,&local_2c1);
  std::allocator<rigtorp::mpmc::Slot<int>_>::~allocator(&local_2c1);
  local_2d0[2] = 0;
  local_2d0[1] = 1;
  bVar1 = rigtorp::mpmc::Queue<int,std::allocator<rigtorp::mpmc::Slot<int>>>::try_push<int,void>
                    ((Queue<int,std::allocator<rigtorp::mpmc::Slot<int>>> *)&local_2c0,local_2d0 + 1
                    );
  if (!bVar1) {
    __assert_fail("q.try_push(1) == true",
                  "/workspace/llm4binary/github/license_c_cmakelists/rigtorp[P]MPMCQueue/src/MPMCQueueTest.cpp"
                  ,99,"int main(int, char **)");
  }
  pVar2 = rigtorp::mpmc::Queue<int,_std::allocator<rigtorp::mpmc::Slot<int>_>_>::size(&local_2c0);
  local_779 = 0;
  if (pVar2 == 1) {
    bVar1 = rigtorp::mpmc::Queue<int,_std::allocator<rigtorp::mpmc::Slot<int>_>_>::empty(&local_2c0)
    ;
    local_779 = bVar1 ^ 0xff;
  }
  if ((local_779 & 1) == 0) {
    __assert_fail("q.size() == 1 && !q.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/rigtorp[P]MPMCQueue/src/MPMCQueueTest.cpp"
                  ,100,"int main(int, char **)");
  }
  local_2d0[0] = 2;
  bVar1 = rigtorp::mpmc::Queue<int,std::allocator<rigtorp::mpmc::Slot<int>>>::try_push<int,void>
                    ((Queue<int,std::allocator<rigtorp::mpmc::Slot<int>>> *)&local_2c0,local_2d0);
  if (bVar1) {
    __assert_fail("q.try_push(2) == false",
                  "/workspace/llm4binary/github/license_c_cmakelists/rigtorp[P]MPMCQueue/src/MPMCQueueTest.cpp"
                  ,0x65,"int main(int, char **)");
  }
  pVar2 = rigtorp::mpmc::Queue<int,_std::allocator<rigtorp::mpmc::Slot<int>_>_>::size(&local_2c0);
  local_77a = 0;
  if (pVar2 == 1) {
    bVar1 = rigtorp::mpmc::Queue<int,_std::allocator<rigtorp::mpmc::Slot<int>_>_>::empty(&local_2c0)
    ;
    local_77a = bVar1 ^ 0xff;
  }
  if ((local_77a & 1) == 0) {
    __assert_fail("q.size() == 1 && !q.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/rigtorp[P]MPMCQueue/src/MPMCQueueTest.cpp"
                  ,0x66,"int main(int, char **)");
  }
  bVar1 = rigtorp::mpmc::Queue<int,_std::allocator<rigtorp::mpmc::Slot<int>_>_>::try_pop
                    (&local_2c0,local_2d0 + 2);
  if (!bVar1 || local_2d0[2] != 1) {
    __assert_fail("q.try_pop(t) == true && t == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/rigtorp[P]MPMCQueue/src/MPMCQueueTest.cpp"
                  ,0x67,"int main(int, char **)");
  }
  pVar2 = rigtorp::mpmc::Queue<int,_std::allocator<rigtorp::mpmc::Slot<int>_>_>::size(&local_2c0);
  local_77c = false;
  if (pVar2 == 0) {
    local_77c = rigtorp::mpmc::Queue<int,_std::allocator<rigtorp::mpmc::Slot<int>_>_>::empty
                          (&local_2c0);
  }
  if (local_77c == false) {
    __assert_fail("q.size() == 0 && q.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/rigtorp[P]MPMCQueue/src/MPMCQueueTest.cpp"
                  ,0x68,"int main(int, char **)");
  }
  bVar1 = rigtorp::mpmc::Queue<int,_std::allocator<rigtorp::mpmc::Slot<int>_>_>::try_pop
                    (&local_2c0,local_2d0 + 2);
  if (bVar1 || local_2d0[2] != 1) {
    __assert_fail("q.try_pop(t) == false && t == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/rigtorp[P]MPMCQueue/src/MPMCQueueTest.cpp"
                  ,0x69,"int main(int, char **)");
  }
  pVar2 = rigtorp::mpmc::Queue<int,_std::allocator<rigtorp::mpmc::Slot<int>_>_>::size(&local_2c0);
  local_77e = false;
  if (pVar2 == 0) {
    local_77e = rigtorp::mpmc::Queue<int,_std::allocator<rigtorp::mpmc::Slot<int>_>_>::empty
                          (&local_2c0);
  }
  if (local_77e == false) {
    __assert_fail("q.size() == 0 && q.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/rigtorp[P]MPMCQueue/src/MPMCQueueTest.cpp"
                  ,0x6a,"int main(int, char **)");
  }
  rigtorp::mpmc::Queue<int,_std::allocator<rigtorp::mpmc::Slot<int>_>_>::~Queue(&local_2c0);
  std::allocator<rigtorp::mpmc::Slot<Test>_>::allocator(&local_3c1);
  rigtorp::mpmc::Queue<Test,_std::allocator<rigtorp::mpmc::Slot<Test>_>_>::Queue
            (&local_3c0,0x10,&local_3c1);
  std::allocator<rigtorp::mpmc::Slot<Test>_>::~allocator(&local_3c1);
  main::Test::Test(&local_3c2);
  rigtorp::mpmc::Queue<main::Test,std::allocator<rigtorp::mpmc::Slot<main::Test>>>::
  emplace<main::Test&>
            ((Queue<main::Test,std::allocator<rigtorp::mpmc::Slot<main::Test>>> *)&local_3c0,
             &local_3c2);
  rigtorp::mpmc::Queue<main::Test,std::allocator<rigtorp::mpmc::Slot<main::Test>>>::
  try_emplace<main::Test&>
            ((Queue<main::Test,std::allocator<rigtorp::mpmc::Slot<main::Test>>> *)&local_3c0,
             &local_3c2);
  rigtorp::mpmc::Queue<main::Test,std::allocator<rigtorp::mpmc::Slot<main::Test>>>::
  push<main::Test&,void>
            ((Queue<main::Test,std::allocator<rigtorp::mpmc::Slot<main::Test>>> *)&local_3c0,
             &local_3c2);
  rigtorp::mpmc::Queue<main::Test,std::allocator<rigtorp::mpmc::Slot<main::Test>>>::
  try_push<main::Test&,void>
            ((Queue<main::Test,std::allocator<rigtorp::mpmc::Slot<main::Test>>> *)&local_3c0,
             &local_3c2);
  main::Test::Test(&local_3c3);
  rigtorp::mpmc::Queue<Test,_std::allocator<rigtorp::mpmc::Slot<Test>_>_>::push
            (&local_3c0,&local_3c3);
  main::Test::Test(&local_3c4);
  rigtorp::mpmc::Queue<Test,_std::allocator<rigtorp::mpmc::Slot<Test>_>_>::try_push
            (&local_3c0,&local_3c4);
  rigtorp::mpmc::Queue<Test,_std::allocator<rigtorp::mpmc::Slot<Test>_>_>::~Queue(&local_3c0);
  std::allocator<rigtorp::mpmc::Slot<std::unique_ptr<int,_std::default_delete<int>_>_>_>::allocator
            (&local_4c1);
  rigtorp::mpmc::
  Queue<std::unique_ptr<int,_std::default_delete<int>_>,_std::allocator<rigtorp::mpmc::Slot<std::unique_ptr<int,_std::default_delete<int>_>_>_>_>
  ::Queue(&local_4c0,0x10,&local_4c1);
  std::allocator<rigtorp::mpmc::Slot<std::unique_ptr<int,_std::default_delete<int>_>_>_>::~allocator
            (&local_4c1);
  piVar4 = (pointer)operator_new(4);
  *piVar4 = 1;
  std::unique_ptr<int,std::default_delete<int>>::unique_ptr<std::default_delete<int>,void>
            ((unique_ptr<int,std::default_delete<int>> *)&local_4d0,piVar4);
  piVar4 = (pointer)operator_new(4);
  *piVar4 = 1;
  std::unique_ptr<int,std::default_delete<int>>::unique_ptr<std::default_delete<int>,void>
            (local_4d8,piVar4);
  rigtorp::mpmc::
  Queue<std::unique_ptr<int,std::default_delete<int>>,std::allocator<rigtorp::mpmc::Slot<std::unique_ptr<int,std::default_delete<int>>>>>
  ::emplace<std::unique_ptr<int,std::default_delete<int>>>
            ((Queue<std::unique_ptr<int,std::default_delete<int>>,std::allocator<rigtorp::mpmc::Slot<std::unique_ptr<int,std::default_delete<int>>>>>
              *)&local_4c0,(unique_ptr<int,_std::default_delete<int>_> *)local_4d8);
  std::unique_ptr<int,_std::default_delete<int>_>::~unique_ptr
            ((unique_ptr<int,_std::default_delete<int>_> *)local_4d8);
  piVar4 = (pointer)operator_new(4);
  *piVar4 = 1;
  std::unique_ptr<int,std::default_delete<int>>::unique_ptr<std::default_delete<int>,void>
            (local_4e0,piVar4);
  rigtorp::mpmc::
  Queue<std::unique_ptr<int,std::default_delete<int>>,std::allocator<rigtorp::mpmc::Slot<std::unique_ptr<int,std::default_delete<int>>>>>
  ::try_emplace<std::unique_ptr<int,std::default_delete<int>>>
            ((Queue<std::unique_ptr<int,std::default_delete<int>>,std::allocator<rigtorp::mpmc::Slot<std::unique_ptr<int,std::default_delete<int>>>>>
              *)&local_4c0,(unique_ptr<int,_std::default_delete<int>_> *)local_4e0);
  std::unique_ptr<int,_std::default_delete<int>_>::~unique_ptr
            ((unique_ptr<int,_std::default_delete<int>_> *)local_4e0);
  piVar4 = (pointer)operator_new(4);
  *piVar4 = 1;
  std::unique_ptr<int,std::default_delete<int>>::unique_ptr<std::default_delete<int>,void>
            (local_4e8,piVar4);
  rigtorp::mpmc::
  Queue<std::unique_ptr<int,std::default_delete<int>>,std::allocator<rigtorp::mpmc::Slot<std::unique_ptr<int,std::default_delete<int>>>>>
  ::push<std::unique_ptr<int,std::default_delete<int>>,void>
            ((Queue<std::unique_ptr<int,std::default_delete<int>>,std::allocator<rigtorp::mpmc::Slot<std::unique_ptr<int,std::default_delete<int>>>>>
              *)&local_4c0,(unique_ptr<int,_std::default_delete<int>_> *)local_4e8);
  std::unique_ptr<int,_std::default_delete<int>_>::~unique_ptr
            ((unique_ptr<int,_std::default_delete<int>_> *)local_4e8);
  piVar4 = (pointer)operator_new(4);
  *piVar4 = 1;
  std::unique_ptr<int,std::default_delete<int>>::unique_ptr<std::default_delete<int>,void>
            (local_4f0,piVar4);
  rigtorp::mpmc::
  Queue<std::unique_ptr<int,std::default_delete<int>>,std::allocator<rigtorp::mpmc::Slot<std::unique_ptr<int,std::default_delete<int>>>>>
  ::try_push<std::unique_ptr<int,std::default_delete<int>>,void>
            ((Queue<std::unique_ptr<int,std::default_delete<int>>,std::allocator<rigtorp::mpmc::Slot<std::unique_ptr<int,std::default_delete<int>>>>>
              *)&local_4c0,(unique_ptr<int,_std::default_delete<int>_> *)local_4f0);
  std::unique_ptr<int,_std::default_delete<int>_>::~unique_ptr
            ((unique_ptr<int,_std::default_delete<int>_> *)local_4f0);
  std::unique_ptr<int,_std::default_delete<int>_>::~unique_ptr(&local_4d0);
  rigtorp::mpmc::
  Queue<std::unique_ptr<int,_std::default_delete<int>_>,_std::allocator<rigtorp::mpmc::Slot<std::unique_ptr<int,_std::default_delete<int>_>_>_>_>
  ::~Queue(&local_4c0);
  local_4f1 = 0;
  std::allocator<rigtorp::mpmc::Slot<int>_>::allocator(&local_5c1);
  rigtorp::mpmc::Queue<int,_std::allocator<rigtorp::mpmc::Slot<int>_>_>::Queue
            (&local_5c0,0,&local_5c1);
  std::allocator<rigtorp::mpmc::Slot<int>_>::~allocator(&local_5c1);
  rigtorp::mpmc::Queue<int,_std::allocator<rigtorp::mpmc::Slot<int>_>_>::~Queue(&local_5c0);
  if ((local_4f1 & 1) != 1) {
    __assert_fail("throws == true",
                  "/workspace/llm4binary/github/license_c_cmakelists/rigtorp[P]MPMCQueue/src/MPMCQueueTest.cpp"
                  ,0x98,"int main(int, char **)");
  }
  local_5d8 = 1000;
  local_5e0 = 10;
  std::allocator<rigtorp::mpmc::Slot<unsigned_long>_>::allocator(&local_6c1);
  rigtorp::mpmc::Queue<unsigned_long,_std::allocator<rigtorp::mpmc::Slot<unsigned_long>_>_>::Queue
            (&local_6c0,10,&local_6c1);
  std::allocator<rigtorp::mpmc::Slot<unsigned_long>_>::~allocator(&local_6c1);
  memset(&local_6c2,0,1);
  std::vector<std::thread,_std::allocator<std::thread>_>::vector(&local_6e0);
  memset(&local_6e8,0,8);
  for (local_6f0 = 0; local_6f0 < 10; local_6f0 = local_6f0 + 1) {
    local_710.i = local_6f0;
    local_710.flag = &local_6c2;
    local_710.q = &local_6c0;
    std::thread::thread<main::__0,,void>(&local_6f8,&local_710);
    std::vector<std::thread,_std::allocator<std::thread>_>::push_back(&local_6e0,&local_6f8);
    std::thread::~thread(&local_6f8);
  }
  for (local_718 = 0; local_718 < 10; local_718 = local_718 + 1) {
    local_740.i = local_718;
    local_740.flag = &local_6c2;
    local_740.q = &local_6c0;
    local_740.sum = &local_6e8;
    std::thread::thread<main::__1,,void>(&local_720,&local_740);
    std::vector<std::thread,_std::allocator<std::thread>_>::push_back(&local_6e0,&local_720);
    std::thread::~thread(&local_720);
  }
  std::atomic<bool>::operator=(&local_6c2,true);
  local_748 = &local_6e0;
  local_750._M_current =
       (thread *)std::vector<std::thread,_std::allocator<std::thread>_>::begin(local_748);
  local_758._M_current =
       (thread *)std::vector<std::thread,_std::allocator<std::thread>_>::end(local_748);
  while (bVar1 = __gnu_cxx::operator!=(&local_750,&local_758), bVar1) {
    __gnu_cxx::
    __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>::
    operator*(&local_750);
    std::thread::join();
    __gnu_cxx::
    __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>::
    operator++(&local_750);
  }
  _Var5 = std::__atomic_base::operator_cast_to_unsigned_long((__atomic_base *)&local_6e8);
  if (_Var5 == 0x79f2c) {
    std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&local_6e0);
    rigtorp::mpmc::Queue<unsigned_long,_std::allocator<rigtorp::mpmc::Slot<unsigned_long>_>_>::
    ~Queue(&local_6c0);
    return 0;
  }
  __assert_fail("sum == numOps * (numOps - 1) / 2",
                "/workspace/llm4binary/github/license_c_cmakelists/rigtorp[P]MPMCQueue/src/MPMCQueueTest.cpp"
                ,0xbd,"int main(int, char **)");
}

Assistant:

int main(int argc, char *argv[]) {
  (void)argc, (void)argv;

  using namespace rigtorp;

  {
    MPMCQueue<TestType> q(11);
    assert(q.size() == 0 && q.empty());
    for (int i = 0; i < 10; i++) {
      q.emplace();
    }
    assert(q.size() == 10 && !q.empty());
    assert(TestType::constructed.size() == 10);

    TestType t;
    q.pop(t);
    assert(q.size() == 9 && !q.empty());
    assert(TestType::constructed.size() == 10);

    q.pop(t);
    q.emplace();
    assert(q.size() == 9 && !q.empty());
    assert(TestType::constructed.size() == 10);
  }
  assert(TestType::constructed.size() == 0);

  {
    MPMCQueue<int> q(1);
    int t = 0;
    assert(q.try_push(1) == true);
    assert(q.size() == 1 && !q.empty());
    assert(q.try_push(2) == false);
    assert(q.size() == 1 && !q.empty());
    assert(q.try_pop(t) == true && t == 1);
    assert(q.size() == 0 && q.empty());
    assert(q.try_pop(t) == false && t == 1);
    assert(q.size() == 0 && q.empty());
  }

  // Copyable only type
  {
    struct Test {
      Test() {}
      Test(const Test &) noexcept {}
      Test &operator=(const Test &) noexcept { return *this; }
      Test(Test &&) = delete;
    };
    MPMCQueue<Test> q(16);
    // lvalue
    Test v;
    q.emplace(v);
    q.try_emplace(v);
    q.push(v);
    q.try_push(v);
    // xvalue
    q.push(Test());
    q.try_push(Test());
  }

  // Movable only type
  {
    MPMCQueue<std::unique_ptr<int>> q(16);
    // lvalue
    auto v = std::unique_ptr<int>(new int(1));
    // q.emplace(v);
    // q.try_emplace(v);
    // q.push(v);
    // q.try_push(v);
    // xvalue
    q.emplace(std::unique_ptr<int>(new int(1)));
    q.try_emplace(std::unique_ptr<int>(new int(1)));
    q.push(std::unique_ptr<int>(new int(1)));
    q.try_push(std::unique_ptr<int>(new int(1)));
  }

  {
    bool throws = false;
    try {
      MPMCQueue<int> q(0);
    } catch (std::exception &) {
      throws = true;
    }
    assert(throws == true);
  }

  // Fuzz test
  {
    const uint64_t numOps = 1000;
    const uint64_t numThreads = 10;
    MPMCQueue<uint64_t> q(numThreads);
    std::atomic<bool> flag(false);
    std::vector<std::thread> threads;
    std::atomic<uint64_t> sum(0);
    for (uint64_t i = 0; i < numThreads; ++i) {
      threads.push_back(std::thread([&, i] {
        while (!flag)
          ;
        for (auto j = i; j < numOps; j += numThreads) {
          q.push(j);
        }
      }));
    }
    for (uint64_t i = 0; i < numThreads; ++i) {
      threads.push_back(std::thread([&, i] {
        while (!flag)
          ;
        uint64_t threadSum = 0;
        for (auto j = i; j < numOps; j += numThreads) {
          uint64_t v;
          q.pop(v);
          threadSum += v;
        }
        sum += threadSum;
      }));
    }
    flag = true;
    for (auto &thread : threads) {
      thread.join();
    }
    assert(sum == numOps * (numOps - 1) / 2);
  }

  return 0;
}